

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<void_(henson::ChaiScheduler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/scheduler.cpp:25:21)>
::do_call(Proxy_Function_Callable_Impl<void_(henson::ChaiScheduler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>,_int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_scheduler_cpp:25:21)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  _Rb_tree_node_base *__lhs;
  _Rb_tree_header *p_Var1;
  Proxy_Function_Callable_Impl<void_(henson::ChaiScheduler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>,_int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_scheduler_cpp:25:21)>
  *pPVar2;
  __type_conflict1 _Var3;
  Result_Type size;
  Result_Type RVar4;
  Result_Type pCVar5;
  _Base_ptr p_Var6;
  Type_Conversions_State *in_RCX;
  Type_Conversions_State *t_conversions_00;
  int *__args_1;
  int iVar7;
  Boxed_Value BVar8;
  int leftover_group_size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unspecified;
  int sz;
  Vector groups_vector;
  int local_18c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  undefined1 local_168 [32];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_148;
  Result_Type local_128;
  Proxy_Function_Callable_Impl<void_(henson::ChaiScheduler_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>,_int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_scheduler_cpp:25:21)>
  *local_120;
  pointer *local_118;
  chaiscript local_110 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  MemoryBuffer local_100;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_d8;
  Result_Type local_c0;
  Result_Type local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  local_60;
  
  t_conversions_00 = in_RCX;
  pCVar5 = boxed_cast<henson::ChaiScheduler*>
                     ((Boxed_Value *)(t_conversions->m_conversions)._M_data,in_RCX);
  boxed_cast<std::__cxx11::string>
            (&local_a0,
             (chaiscript *)
             ((((t_conversions->m_conversions)._M_data)->m_mutex).super_mutex.super___mutex_base.
              _M_mutex.__size + 0x10),(Boxed_Value *)in_RCX,t_conversions_00);
  boxed_cast<std::__cxx11::string>
            (&local_c0,
             (chaiscript *)
             &(((t_conversions->m_conversions)._M_data)->m_mutex).super_mutex.super___mutex_base.
              _M_mutex.__data.__list.__next,(Boxed_Value *)in_RCX,t_conversions_00);
  boxed_cast<chaiscript::Boxed_Value>
            (local_110,
             (Boxed_Value *)
             &(((t_conversions->m_conversions)._M_data)->m_conversions)._M_t._M_impl.
              super__Rb_tree_header,in_RCX);
  boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            ((Result_Type *)&local_60,
             (chaiscript *)
             &(((t_conversions->m_conversions)._M_data)->m_conversions)._M_t._M_impl.
              super__Rb_tree_header._M_header._M_left,(Boxed_Value *)in_RCX,t_conversions_00);
  size = boxed_cast<int>((Boxed_Value *)
                         &(((t_conversions->m_conversions)._M_data)->m_conversions)._M_t._M_impl.
                          super__Rb_tree_header._M_node_count,in_RCX);
  local_118 = &params[1].
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_148.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  iVar7 = 0;
  for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    RVar4 = boxed_cast<int>((Boxed_Value *)(p_Var6 + 2),(Type_Conversions_State *)0x0);
    if (RVar4 < 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_188,(value_type *)(p_Var6 + 1));
    }
    else {
      iVar7 = iVar7 + RVar4;
    }
  }
  local_18c = (int)((ulong)(long)size /
                   (ulong)((long)local_188.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_188.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128 = pCVar5;
  local_120 = this;
  do {
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      local_100.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR_save_binary_00322070;
      local_100.position = 0;
      local_100.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_100.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_100.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>::operator()
                ((function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *)local_168,
                 (Boxed_Value *)local_118);
      henson::Serialization<chaiscript::Boxed_Value>::save
                (&local_100.super_BinaryBuffer,(Boxed_Value *)local_168);
      pPVar2 = local_120;
      pCVar5 = local_128;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8));
      std::__cxx11::string::string((string *)local_168,(string *)&local_a0);
      std::__cxx11::string::string((string *)&local_80,(string *)&local_c0);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::vector(&local_d8,&local_148);
      henson::Scheduler::schedule
                (&pCVar5->super_Scheduler,(string *)local_168,&local_80,&local_100,&local_d8,size);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~vector(&local_d8);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)local_168);
      henson::MemoryBuffer::~MemoryBuffer(&local_100);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_188);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~vector(&local_148);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
      ::~_Rb_tree(&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      BVar8 = detail::Handle_Return<void>::handle();
      BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pPVar2;
      return (Boxed_Value)
             BVar8.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
    local_168._0_4_ = boxed_cast<int>((Boxed_Value *)(p_Var6 + 2),(Type_Conversions_State *)0x0);
    __lhs = p_Var6 + 1;
    __args_1 = (int *)local_168;
    if ((int)local_168._0_4_ < 1) {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,local_188.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1);
      __args_1 = &local_18c;
      if (!_Var3) goto LAB_001cc0dc;
      local_100.super_BinaryBuffer._vptr_BinaryBuffer =
           (_func_int **)
           ((long)(size - iVar7) -
           (((long)local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_188.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5) + -1) * (long)local_18c);
      std::
      vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
      ::emplace_back<std::__cxx11::string_const&,unsigned_long>
                ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                  *)&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (unsigned_long *)&local_100);
    }
    else {
LAB_001cc0dc:
      std::
      vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
      ::emplace_back<std::__cxx11::string_const&,int&>
                ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                  *)&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__args_1
                );
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }